

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int cvLsFreeB(CVodeBMem cvB_mem)

{
  long in_RDI;
  CVLsMemB cvlsB_mem;
  
  if ((in_RDI != 0) && (*(long *)(in_RDI + 0x48) != 0)) {
    free(*(void **)(in_RDI + 0x48));
  }
  return 0;
}

Assistant:

int cvLsFreeB(CVodeBMem cvB_mem)
{
  CVLsMemB cvlsB_mem;

  /* Return immediately if cvB_mem or cvB_mem->cv_lmem are NULL */
  if (cvB_mem == NULL) { return (CVLS_SUCCESS); }
  if (cvB_mem->cv_lmem == NULL) { return (CVLS_SUCCESS); }
  cvlsB_mem = (CVLsMemB)(cvB_mem->cv_lmem);

  /* free CVLsMemB interface structure */
  free(cvlsB_mem);

  return (CVLS_SUCCESS);
}